

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O2

int __thiscall llvm::StringMapImpl::FindKey(StringMapImpl *this,StringRef Key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntryBase **ppSVar4;
  StringMapEntryBase *pSVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t in_ECX;
  ulong __n;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint32_t uVar11;
  StringRef Buffer;
  
  __n = Key.Length;
  uVar1 = this->NumBuckets;
  uVar8 = 0xffffffff;
  if (uVar1 != 0) {
    Buffer.Length = 0;
    Buffer.Data = (char *)__n;
    uVar6 = djbHash((llvm *)Key.Data,Buffer,in_ECX);
    ppSVar4 = this->TheTable;
    uVar2 = this->NumBuckets;
    uVar3 = this->ItemSize;
    iVar9 = 1;
    uVar11 = uVar6;
    while( true ) {
      uVar10 = uVar11 & uVar1 - 1;
      pSVar5 = ppSVar4[uVar10];
      uVar8 = 0xffffffff;
      if ((pSVar5 == (StringMapEntryBase *)0x0) ||
         ((((pSVar5 != (StringMapEntryBase *)0xfffffffffffffff8 &&
            (*(uint32_t *)((long)ppSVar4 + (ulong)uVar10 * 4 + (ulong)uVar2 * 8 + 8) == uVar6)) &&
           (pSVar5->StrLen == __n)) &&
          ((uVar8 = uVar10, __n == 0 ||
           (iVar7 = bcmp((llvm *)Key.Data,(void *)((long)&pSVar5->StrLen + (ulong)uVar3),__n),
           iVar7 == 0)))))) break;
      uVar11 = uVar10 + iVar9;
      iVar9 = iVar9 + 1;
    }
  }
  return uVar8;
}

Assistant:

int StringMapImpl::FindKey(StringRef Key) const {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) return -1;  // Really empty table?
  unsigned FullHashValue = djbHash(Key, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return.
    if (LLVM_LIKELY(!BucketItem))
      return -1;

    if (BucketItem == getTombstoneVal()) {
      // Ignore tombstones.
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because NameStart isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Key == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}